

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void mv_bubble(level *lev,bubble *b,int dx,int dy,boolean ini)

{
  undefined1 uVar1;
  container *pcVar2;
  obj *poVar3;
  void *pvVar4;
  int y_00;
  int iVar5;
  monst *local_80;
  trap *btrap;
  int uy0;
  int ux0;
  monst *mon;
  obj *otmp;
  obj *olist;
  container *ctemp;
  container *cons;
  int colli;
  int j;
  int i;
  int y;
  int x;
  int iStack_1c;
  boolean ini_local;
  int dy_local;
  int dx_local;
  bubble *b_local;
  level *lev_local;
  
  cons._0_4_ = 0;
  if ((((dx < -1) || (1 < dx)) || (dy < -1)) || (x = dy, iStack_1c = dx, 1 < dy)) {
    iStack_1c = sgn(dx);
    x = sgn(dy);
  }
  if ((int)b->x <= xmin + 1) {
    cons._0_4_ = 2;
  }
  if ((int)b->y <= ymin + 1) {
    cons._0_4_ = (uint)cons | 1;
  }
  if (xmax + -1 <= (int)((int)b->x + (uint)*b->bm + -1)) {
    cons._0_4_ = (uint)cons | 2;
  }
  if (ymax + -1 <= (int)((int)b->y + (uint)b->bm[1] + -1)) {
    cons._0_4_ = (uint)cons | 1;
  }
  if ((int)b->x < xmin + 1) {
    pline("bubble xmin: x = %d, xmin = %d",(ulong)(uint)(int)b->x,(ulong)(xmin + 1));
    b->x = (char)xmin + '\x01';
  }
  if ((int)b->y < ymin + 1) {
    pline("bubble ymin: y = %d, ymin = %d",(ulong)(uint)(int)b->y,(ulong)(ymin + 1));
    b->y = (char)ymin + '\x01';
  }
  if (xmax + -1 < (int)((int)b->x + (uint)*b->bm + -1)) {
    pline("bubble xmax: x = %d, xmax = %d",(ulong)(((int)b->x + (uint)*b->bm) - 1),(ulong)(xmax - 1)
         );
    b->x = (char)xmax - *b->bm;
  }
  if (ymax + -1 < (int)((int)b->y + (uint)b->bm[1] + -1)) {
    pline("bubble ymax: y = %d, ymax = %d",(ulong)(((int)b->y + (uint)b->bm[1]) - 1),
          (ulong)(ymax - 1));
    b->y = (char)ymax - b->bm[1];
  }
  if (((int)b->x == xmin + 1) && (iStack_1c < 0)) {
    iStack_1c = -iStack_1c;
  }
  if (((int)b->x + (uint)*b->bm + -1 == xmax + -1) && (0 < iStack_1c)) {
    iStack_1c = -iStack_1c;
  }
  if (((int)b->y == ymin + 1) && (x < 0)) {
    x = -x;
  }
  if (((int)b->y + (uint)b->bm[1] + -1 == ymax + -1) && (0 < x)) {
    x = -x;
  }
  b->x = b->x + (char)iStack_1c;
  b->y = b->y + (char)x;
  colli = 0;
  i = (int)b->x;
  for (; colli < (int)(uint)*b->bm; colli = colli + 1) {
    cons._4_4_ = 0;
    j = (int)b->y;
    for (; cons._4_4_ < (int)(uint)b->bm[1]; cons._4_4_ = cons._4_4_ + 1) {
      if (((uint)b->bm[cons._4_4_ + 2] & 1 << ((byte)colli & 0x1f)) != 0) {
        lev->locations[i][j].typ = '%';
        *(uint *)&lev->locations[i][j].field_0x6 =
             *(uint *)&lev->locations[i][j].field_0x6 & 0xfffffbff | 0x400;
        unblock_point(i,j);
      }
      j = j + 1;
    }
    i = i + 1;
  }
  ctemp = b->cons;
  while (ctemp != (container *)0x0) {
    pcVar2 = ctemp->next;
    uVar1 = ctemp->x;
    ctemp->x = uVar1 + (char)iStack_1c;
    ctemp->y = ctemp->y + (char)x;
    switch(ctemp->what) {
    case 0:
      otmp = (obj *)ctemp->list;
      while (otmp != (obj *)0x0) {
        poVar3 = (otmp->v).v_nexthere;
        place_object(otmp,lev,(int)ctemp->x,(int)ctemp->y);
        otmp = poVar3;
      }
      break;
    case 1:
      mnearto((monst *)ctemp->list,ctemp->x,ctemp->y,'\x01');
      break;
    case 2:
      iVar5 = (int)u.ux;
      y_00 = (int)u.uy;
      u.ux = ctemp->x;
      u.uy = ctemp->y;
      newsym(iVar5,y_00);
      if ((lev->monsters[ctemp->x][ctemp->y] != (monst *)0x0) &&
         ((*(uint *)&lev->monsters[ctemp->x][ctemp->y]->field_0x60 >> 9 & 1) == 0)) {
        if ((lev->monsters[ctemp->x][ctemp->y] == (monst *)0x0) ||
           ((*(uint *)&lev->monsters[ctemp->x][ctemp->y]->field_0x60 >> 9 & 1) != 0)) {
          local_80 = (monst *)0x0;
        }
        else {
          local_80 = lev->monsters[ctemp->x][ctemp->y];
        }
        mnexto(local_80);
      }
      break;
    case 3:
      pvVar4 = ctemp->list;
      *(xchar *)((long)pvVar4 + 9) = ctemp->x;
      *(xchar *)((long)pvVar4 + 10) = ctemp->y;
      break;
    default:
      impossible("mv_bubble: unknown bubble contents");
    }
    free(ctemp);
    ctemp = pcVar2;
  }
  b->cons = (container *)0x0;
  if ((uint)cons == 1) {
    b->dy = -b->dy;
  }
  else {
    if ((uint)cons != 2) {
      if ((uint)cons != 3) {
        if (ini != '\0') {
          return;
        }
        if ((b->dx == '\0') && (b->dy == '\0')) {
          iVar5 = rn2(5);
        }
        else {
          iVar5 = rn2(0x14);
        }
        if (iVar5 != 0) {
          return;
        }
        iVar5 = rn2(3);
        b->dx = '\x01' - (char)iVar5;
        iVar5 = rn2(3);
        b->dy = '\x01' - (char)iVar5;
        return;
      }
      b->dy = -b->dy;
    }
    b->dx = -b->dx;
  }
  return;
}

Assistant:

static void mv_bubble(struct level *lev, struct bubble *b, int dx, int dy, boolean ini)
{
	int x, y, i, j, colli = 0;
	struct container *cons, *ctemp;

	/* move bubble */
	if (dx < -1 || dx > 1 || dy < -1 || dy > 1) {
	    /* pline("mv_bubble: dx = %d, dy = %d", dx, dy); */
	    dx = sgn(dx);
	    dy = sgn(dy);
	}

	/*
	 * collision with level borders?
	 *	1 = horizontal border, 2 = vertical, 3 = corner
	 */
	if (b->x <= bxmin) colli |= 2;
	if (b->y <= bymin) colli |= 1;
	if ((int) (b->x + b->bm[0] - 1) >= bxmax) colli |= 2;
	if ((int) (b->y + b->bm[1] - 1) >= bymax) colli |= 1;

	if (b->x < bxmin) {
	    pline("bubble xmin: x = %d, xmin = %d", b->x, bxmin);
	    b->x = bxmin;
	}
	if (b->y < bymin) {
	    pline("bubble ymin: y = %d, ymin = %d", b->y, bymin);
	    b->y = bymin;
	}
	if ((int) (b->x + b->bm[0] - 1) > bxmax) {
	    pline("bubble xmax: x = %d, xmax = %d",
			b->x + b->bm[0] - 1, bxmax);
	    b->x = bxmax - b->bm[0] + 1;
	}
	if ((int) (b->y + b->bm[1] - 1) > bymax) {
	    pline("bubble ymax: y = %d, ymax = %d",
			b->y + b->bm[1] - 1, bymax);
	    b->y = bymax - b->bm[1] + 1;
	}

	/* bounce if we're trying to move off the border */
	if (b->x == bxmin && dx < 0) dx = -dx;
	if (b->x + b->bm[0] - 1 == bxmax && dx > 0) dx = -dx;
	if (b->y == bymin && dy < 0) dy = -dy;
	if (b->y + b->bm[1] - 1 == bymax && dy > 0) dy = -dy;

	b->x += dx;
	b->y += dy;

	/* void positions inside bubble */

	for (i = 0, x = b->x; i < (int) b->bm[0]; i++, x++)
	    for (j = 0, y = b->y; j < (int) b->bm[1]; j++, y++)
		if (b->bm[j + 2] & (1 << i)) {
		    lev->locations[x][y].typ = AIR;
		    lev->locations[x][y].lit = 1;
		    unblock_point(x,y);
		}

	/* replace contents of bubble */
	for (cons = b->cons; cons; cons = ctemp) {
	    ctemp = cons->next;
	    cons->x += dx;
	    cons->y += dy;

	    switch(cons->what) {
		case CONS_OBJ: {
		    struct obj *olist, *otmp;

		    for (olist=(struct obj *)cons->list; olist; olist=otmp) {
			otmp = olist->nexthere;
			place_object(olist, lev, cons->x, cons->y);
		    }
		    break;
		}

		case CONS_MON: {
		    struct monst *mon = (struct monst *) cons->list;
		    mnearto(mon, cons->x, cons->y, TRUE);
		    break;
		}

		case CONS_HERO: {
		    int ux0 = u.ux, uy0 = u.uy;

		    /* change u.ux0 and u.uy0? */
		    u.ux = cons->x;
		    u.uy = cons->y;
		    newsym(ux0, uy0);	/* clean up old position */

		    if (MON_AT(lev, cons->x, cons->y)) {
				mnexto(m_at(lev, cons->x,cons->y));
			}
		    break;
		}

		case CONS_TRAP: {
		    struct trap *btrap = (struct trap *) cons->list;
		    btrap->tx = cons->x;
		    btrap->ty = cons->y;
		    break;
		}

		default:
		    impossible("mv_bubble: unknown bubble contents");
		    break;
	    }
	    free(cons);
	}
	b->cons = 0;

	/* boing? */

	switch (colli) {
	    case 1: b->dy = -b->dy;	break;
	    case 3: b->dy = -b->dy;	/* fall through */
	    case 2: b->dx = -b->dx;	break;
	    default:
		/* sometimes alter direction for fun anyway
		   (higher probability for stationary bubbles) */
		if (!ini && ((b->dx || b->dy) ? !rn2(20) : !rn2(5))) {
			b->dx = 1 - rn2(3);
			b->dy = 1 - rn2(3);
		}
	}
}